

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

string * fmt::v11::vformat_abi_cxx11_(string_view fmt,format_args args)

{
  basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_> *in_RDI;
  memory_buffer buffer;
  allocator<char> *in_stack_fffffffffffffd68;
  locale_ref local_270 [10];
  basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_> *in_stack_fffffffffffffde0;
  buffer<char> *in_stack_fffffffffffffe58;
  locale_ref in_stack_fffffffffffffe60;
  format_args in_stack_fffffffffffffe68;
  string_view in_stack_fffffffffffffe78;
  
  basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::basic_memory_buffer
            (in_RDI,in_stack_fffffffffffffd68);
  detail::locale_ref::locale_ref(local_270);
  detail::vformat_to(in_stack_fffffffffffffe58,in_stack_fffffffffffffe78,in_stack_fffffffffffffe68,
                     in_stack_fffffffffffffe60);
  to_string<500ul>(in_stack_fffffffffffffde0);
  basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::~basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_> *)0xa5f0c1);
  return (string *)in_RDI;
}

Assistant:

FMT_FUNC auto vformat(string_view fmt, format_args args) -> std::string {
  // Don't optimize the "{}" case to keep the binary size small and because it
  // can be better optimized in fmt::format anyway.
  auto buffer = memory_buffer();
  detail::vformat_to(buffer, fmt, args);
  return to_string(buffer);
}